

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::variable<float>(BuiltinPrecisionTests *this,string *name)

{
  Variable<float> *this_00;
  SharedPtrStateBase *extraout_RDX;
  VariableP<float> VVar1;
  
  this_00 = (Variable<float> *)operator_new(0x28);
  Variable<float>::Variable(this_00,name);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::SharedPtr
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> *)this,this_00);
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state =
       extraout_RDX;
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T> variable (const string& name)
{
	return VariableP<T>(new Variable<T>(name));
}